

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O0

void __thiscall Prog::~Prog(Prog *this)

{
  Prog *in_RDI;
  
  ~Prog(in_RDI);
  operator_delete(in_RDI,0x1318);
  return;
}

Assistant:

virtual ~Prog() {}